

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.cc
# Opt level: O2

Module __thiscall
tvm::runtime::GraphRuntimeCreate
          (runtime *this,string *sym_json,Module *m,
          vector<DLContext,_std::allocator<DLContext>_> *ctxs)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Module MVar1;
  shared_ptr<tvm::runtime::GraphRuntime> exec;
  __shared_ptr<tvm::runtime::GraphRuntime,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::make_shared<tvm::runtime::GraphRuntime>();
  std::__shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,(__shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2> *)m);
  GraphRuntime::Init(local_60._M_ptr,sym_json,(Module *)&local_50,ctxs);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__shared_ptr<tvm::runtime::ModuleNode,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tvm::runtime::GraphRuntime,void>
            ((__shared_ptr<tvm::runtime::ModuleNode,(__gnu_cxx::_Lock_policy)2> *)&local_40,
             &local_60);
  std::__shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2> *)this,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  MVar1.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  MVar1.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Module)MVar1.node_.
                 super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Module GraphRuntimeCreate(const std::string &sym_json,
                          const tvm::runtime::Module &m,
                          const std::vector<TVMContext> &ctxs) {
  std::shared_ptr<GraphRuntime> exec = std::make_shared<GraphRuntime>();
  exec->Init(sym_json, m, ctxs);
  return Module(exec);
}